

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.cpp
# Opt level: O3

void * kmpc_malloc(size_t size)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = __kmp_get_global_thread_id_reg();
  pvVar2 = bget(__kmp_threads[iVar1],size + 8);
  if (pvVar2 == (void *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    *(void **)pvVar2 = pvVar2;
    pvVar2 = (void *)((long)pvVar2 + 8);
  }
  return pvVar2;
}

Assistant:

void *kmpc_malloc(size_t size) {
  void *ptr;
  ptr = bget(__kmp_entry_thread(), (bufsize)(size + sizeof(ptr)));
  if (ptr != NULL) {
    // save allocated pointer just before one returned to user
    *(void **)ptr = ptr;
    ptr = (void **)ptr + 1;
  }
  return ptr;
}